

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void modifier_reset(png_modifier *pm)

{
  uint uVar1;
  uint uVar2;
  png_uint_16 pVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  store_read_reset(&pm->this);
  pm->limit = 0.004;
  pm->pending_len = 0;
  pm->pending_chunk = 0;
  pm->modifications = (png_modification *)0x0;
  pm->state = modifier_start;
  pm->flush = 0;
  pm->buffer_count = 0;
  pm->buffer_position = 0;
  if ((pm->field_0x598 & 3) != 2) {
    if ((pm->field_0x598 & 1) == 0) {
      pm->encoding_counter = 0;
    }
    goto LAB_00110803;
  }
  uVar1 = *(uint *)&pm->field_0x63c;
  if ((uVar1 >> 0x19 & 1) == 0) {
    uVar6 = 0;
    if (pm->encoding_counter == 0) {
      uVar2 = pm->nencodings;
      uVar5 = uVar2;
      if (pm->bit_depth != '\x10') {
        uVar5 = 0;
      }
      if ((uVar1 >> 0x11 & 1) != 0) {
        uVar5 = uVar2;
      }
      uVar1 = pm->ngammas;
      pVar3 = random_u16();
      uVar6 = (uint)pVar3 % (uVar2 + uVar1 + uVar5) + 1;
    }
LAB_001107ed:
    pm->encoding_counter = uVar6;
  }
  else {
    uVar4 = pm->encoding_counter + 1;
    pm->encoding_counter = uVar4;
    uVar6 = 0;
    uVar2 = pm->nencodings;
    uVar5 = uVar2;
    if (pm->bit_depth != '\x10') {
      uVar5 = 0;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      uVar5 = uVar2;
    }
    if (uVar5 + uVar2 + pm->ngammas + 1 <= uVar4) goto LAB_001107ed;
  }
  if (pm->encoding_counter != 0) {
    pm->field_0x598 = pm->field_0x598 | 1;
  }
LAB_00110803:
  pm->field_0x598 = pm->field_0x598 & 0xfd;
  pm->current_gamma = 0.0;
  pm->current_encoding = (color_encoding *)0x0;
  pm->encoding_ignored = 0;
  pm->bit_depth = '\0';
  pm->colour_type = '\0';
  return;
}

Assistant:

static void
modifier_reset(png_modifier *pm)
{
   store_read_reset(&pm->this);
   pm->limit = 4E-3;
   pm->pending_len = pm->pending_chunk = 0;
   pm->flush = pm->buffer_count = pm->buffer_position = 0;
   pm->modifications = NULL;
   pm->state = modifier_start;
   modifier_encoding_iterate(pm);
   /* The following must be set in the next run.  In particular
    * test_uses_encodings must be set in the _ini function of each transform
    * that looks at the encodings.  (Not the 'add' function!)
    */
   pm->test_uses_encoding = 0;
   pm->current_gamma = 0;
   pm->current_encoding = 0;
   pm->encoding_ignored = 0;
   /* These only become value after IHDR is read: */
   pm->bit_depth = pm->colour_type = 0;
}